

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRalgorithm.cpp
# Opt level: O2

vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *
EigQR(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__return_storage_ptr__,
     Matrix *m,int *iter)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pointer pcVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  pointer pcVar11;
  double *pdVar12;
  int i;
  int j;
  pair<std::complex<double>,_std::complex<double>_> local_50;
  
  iVar10 = Matrix::GetCols(m);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (__return_storage_ptr__,(long)iVar10,(allocator_type *)&local_50);
  ToHessenbergForm(m);
  dVar7 = 1.79769313486232e+308;
  it = 0;
  do {
    if ((29999 < it) || (ABS(dVar7) <= 1e-16)) {
      return __return_storage_ptr__;
    }
    IterationQR(m);
    dVar7 = 0.0;
    j = 0;
    while (j < iVar10) {
      if (j == iVar10 + -1) {
        pcVar11 = (__return_storage_ptr__->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
LAB_00105886:
        dVar1 = *(double *)pcVar11[j]._M_value;
        pdVar12 = Matrix::operator()(m,j,j);
        dVar2 = *pdVar12;
        pdVar12 = Matrix::operator()(m,j,j);
        dVar1 = ABS(dVar1 - dVar2);
        pcVar11 = (__return_storage_ptr__->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        *(double *)pcVar11[j]._M_value = *pdVar12;
        *(undefined8 *)(pcVar11[j]._M_value + 8) = 0;
        i = j;
      }
      else {
        i = j + 1;
        pdVar12 = Matrix::operator()(m,i,j);
        pcVar11 = (__return_storage_ptr__->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (ABS(*pdVar12) < 1e-05) goto LAB_00105886;
        dVar8 = *(double *)pcVar11[j]._M_value;
        dVar9 = *(double *)(pcVar11[j]._M_value + 8);
        pdVar12 = Matrix::operator()(m,j,j);
        dVar1 = *pdVar12;
        pdVar12 = Matrix::operator()(m,i,i);
        dVar2 = *pdVar12;
        pdVar12 = Matrix::operator()(m,j,j);
        dVar3 = *pdVar12;
        pdVar12 = Matrix::operator()(m,i,i);
        dVar4 = *pdVar12;
        pdVar12 = Matrix::operator()(m,i,j);
        dVar5 = *pdVar12;
        pdVar12 = Matrix::operator()(m,j,i);
        Utils::SolveQuadratic(&local_50,1.0,-dVar1 - dVar2,dVar3 * dVar4 - dVar5 * *pdVar12);
        pcVar6 = (__return_storage_ptr__->
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar11 = pcVar6 + j;
        *(undefined8 *)pcVar11->_M_value = local_50.first._M_value._0_8_;
        *(undefined8 *)(pcVar11->_M_value + 8) = local_50.first._M_value._8_8_;
        pcVar6 = pcVar6 + i;
        *(undefined8 *)pcVar6->_M_value = local_50.second._M_value._0_8_;
        *(undefined8 *)(pcVar6->_M_value + 8) = local_50.second._M_value._8_8_;
        pcVar11 = (__return_storage_ptr__->
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
                  _M_impl.super__Vector_impl_data._M_start + j;
        dVar1 = ABS(dVar9 - *(double *)(pcVar11->_M_value + 8)) +
                ABS(dVar8 - *(double *)pcVar11->_M_value);
        dVar1 = dVar1 + dVar1;
      }
      dVar7 = dVar7 + dVar1;
      j = i + 1;
    }
    it = it + 1;
  } while( true );
}

Assistant:

std::vector<Complex> EigQR(Matrix m, int &iter)
{
    const int n = m.GetCols();
    std::vector<Complex> eigValues(n);

    ToHessenbergForm(m);

    double diff = std::numeric_limits<double>::max();

    for (it = 0; it < defaultMaxIterations && std::abs(diff) > defaultEPS; ++it)
    {
        diff = 0;

        IterationQR(m);

        for (int d = 0; d < n; d++)
        {
            if (d == n - 1 || std::abs(m(d + 1, d)) < asZero)
            {
                diff += std::abs(eigValues[d].real() - m(d, d));
                eigValues[d] = m(d, d);
            }
            else
            {
                Complex p = eigValues[d];

                double a = 1;
                double b = -m(d, d) - m(d + 1, d + 1);
                double c = m(d, d) * m(d + 1, d + 1) - m(d + 1, d) * m(d, d + 1);
                std::tie(eigValues[d], eigValues[d + 1]) =
                        Utils::SolveQuadratic(a, b, c);

                diff += 2 * (std::abs(p.real() - eigValues[d].real()) +
                        std::abs(p.imag() - eigValues[d].imag()));
                d++;
            }
        }
    }
    return eigValues;
}